

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commands.cpp
# Opt level: O0

command_node * __thiscall
libchars::command_node::add_root(command_node *this,filter_t mask_,bool hidden_)

{
  command_node *this_00;
  command_node *local_50;
  bool hidden__local;
  filter_t mask__local;
  command_node *this_local;
  
  if (this->start == (command_node *)0x0) {
    this_00 = (command_node *)operator_new(0x58,(nothrow_t *)&std::nothrow);
    local_50 = (command_node *)0x0;
    if (this_00 != (command_node *)0x0) {
      command_node(this_00);
      local_50 = this_00;
    }
    this->start = local_50;
    if (this->start != (command_node *)0x0) {
      this->start->mask = mask_;
      this->start->hidden = hidden_;
    }
  }
  return this->start;
}

Assistant:

command_node *command_node::add_root(command::filter_t mask_, bool hidden_)
    {
        if (start == NULL) {
            start = new (std::nothrow) command_node();
            if (start != NULL) {
                start->mask = mask_;
                start->hidden = hidden_;
            }
        }
        return start;
    }